

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O2

size_t __thiscall
embree::FastAllocator::fixSingleThreadThreshold
          (FastAllocator *this,size_t branchingFactor,size_t defaultThreshold,size_t numPrimitives,
          size_t bytesEstimated)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  if (bytesEstimated != 0 && numPrimitives != 0) {
    lVar3 = 0x28;
    if (this->use_single_mode != false) {
      lVar3 = 0x14;
    }
    iVar1 = tbb::detail::d1::max_concurrency();
    uVar2 = lVar3 * this->defaultBlockSize;
    if (((bytesEstimated + uVar2) - 1) / uVar2 < (ulong)(long)iVar1) {
      auVar5._8_4_ = (int)(bytesEstimated >> 0x20);
      auVar5._0_8_ = bytesEstimated;
      auVar5._12_4_ = 0x45300000;
      auVar6._8_4_ = (int)(numPrimitives >> 0x20);
      auVar6._0_8_ = numPrimitives;
      auVar6._12_4_ = 0x45300000;
      lVar3 = uVar2 * branchingFactor;
      auVar7._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar7._0_8_ = lVar3;
      auVar7._12_4_ = 0x45300000;
      dVar4 = ceil(((auVar7._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
                   (((auVar5._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)bytesEstimated) - 4503599627370496.0)) /
                   ((auVar6._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)numPrimitives) - 4503599627370496.0))));
      defaultThreshold = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
    }
  }
  return defaultThreshold;
}

Assistant:

size_t fixSingleThreadThreshold(size_t branchingFactor, size_t defaultThreshold, size_t numPrimitives, size_t bytesEstimated)
    {
      if (numPrimitives == 0 || bytesEstimated == 0) 
        return defaultThreshold;

      /* calculate block size in bytes to fulfill threadLocalAllocOverhead constraint */
      const size_t single_mode_factor = use_single_mode ? 1 : 2;
      const size_t threadCount = TaskScheduler::threadCount();
      const size_t singleThreadBytes = single_mode_factor*threadLocalAllocOverhead*defaultBlockSize;

      /* if we do not have to limit number of threads use optimal thresdhold */
      if ( (bytesEstimated+(singleThreadBytes-1))/singleThreadBytes >= threadCount)
        return defaultThreshold;

      /* otherwise limit number of threads by calculating proper single thread threshold */
      else {
        double bytesPerPrimitive = double(bytesEstimated)/double(numPrimitives);
        return size_t(ceil(branchingFactor*singleThreadBytes/bytesPerPrimitive)); 
      }
    }